

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

NLHeader * ReadHeader(NLHeader *__return_storage_ptr__,int line_index,StringRef line)

{
  string local_180;
  string local_160;
  NLHeader local_140;
  
  memset(&local_140,0,0x110);
  mp::NLHeader::NLHeader(&local_140);
  FormatHeader_abi_cxx11_(&local_160,&local_140,true);
  ReplaceLine(&local_180,&local_160,line_index,line);
  ReadHeader(__return_storage_ptr__,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  return __return_storage_ptr__;
}

Assistant:

NLHeader ReadHeader(int line_index, fmt::StringRef line) {
  return ReadHeader(ReplaceLine(FormatHeader(NLHeader()), line_index, line));
}